

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

void EpdMultiply2(EpDouble *epd1,EpDouble *epd2)

{
  int iVar1;
  double dVar2;
  double dVar3;
  EpType val;
  
  dVar2 = (epd1->type).value;
  if (((uint)((ulong)dVar2 >> 0x34) < 0xfff || ((ulong)dVar2 & 0xfffffffffffff) != 0x8000000000000)
     && (dVar3 = (epd2->type).value,
        ((ulong)dVar3 & 0xfffffffffffff) != 0x8000000000000 || (ulong)dVar3 < 0xfff0000000000000)) {
    if (ABS(dVar2) != INFINITY && ABS(dVar3) != INFINITY) {
      if (((ulong)dVar2 & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                      ,0x106,"void EpdMultiply2(EpDouble *, EpDouble *)");
      }
      if (((ulong)dVar3 & 0x7ff0000000000000) == 0x3ff0000000000000) {
        iVar1 = epd2->exponent;
        (epd1->type).value = dVar2 * dVar3;
        epd1->exponent = epd1->exponent + iVar1;
        EpdNormalize(epd1);
        return;
      }
      __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                    ,0x107,"void EpdMultiply2(EpDouble *, EpDouble *)");
    }
    epd1->type = (EpTypeUnion)
                 (((ulong)dVar2 ^ (ulong)dVar3) & 0x8000000000000000 | 0x7ff0000000000000);
  }
  else {
    (epd1->type).value = -NAN;
  }
  epd1->exponent = 0;
  return;
}

Assistant:

void
EpdMultiply2(EpDouble *epd1, EpDouble *epd2)
{
  double        value;
  int           exponent;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
    EpdMakeInf(epd1, sign);
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  value = epd1->type.value * epd2->type.value;
  exponent = epd1->exponent + epd2->exponent;
  epd1->type.value = value;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}